

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_name2id(bam_hdr_t *h,char *ref)

{
  khint_t kVar1;
  int local_38;
  int local_2c;
  int local_28;
  int absent;
  int i;
  khint_t k;
  sdict_t *d;
  char *ref_local;
  bam_hdr_t *h_local;
  
  _i = (kh_s2i_t *)h->sdict;
  d = (sdict_t *)ref;
  ref_local = (char *)h;
  if (h->sdict == (void *)0x0) {
    _i = kh_init_s2i();
    for (local_28 = 0; local_28 < *(int *)ref_local; local_28 = local_28 + 1) {
      absent = kh_put_s2i(_i,*(kh_cstr_t *)(*(long *)(ref_local + 0x20) + (long)local_28 * 8),
                          &local_2c);
      _i->vals[(uint)absent] = (long)local_28;
    }
    *(kh_s2i_t **)(ref_local + 0x30) = _i;
  }
  kVar1 = kh_get_s2i(_i,(kh_cstr_t)d);
  if (kVar1 == _i->n_buckets) {
    local_38 = -1;
  }
  else {
    local_38 = (int)_i->vals[kVar1];
  }
  return local_38;
}

Assistant:

int bam_name2id(bam_hdr_t *h, const char *ref)
{
    sdict_t *d = (sdict_t*)h->sdict;
    khint_t k;
    if (h->sdict == 0) {
        int i, absent;
        d = kh_init(s2i);
        for (i = 0; i < h->n_targets; ++i) {
            k = kh_put(s2i, d, h->target_name[i], &absent);
            kh_val(d, k) = i;
        }
        h->sdict = d;
    }
    k = kh_get(s2i, d, ref);
    return k == kh_end(d)? -1 : kh_val(d, k);
}